

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
DirectChainedMap<TypeLookupResult>::DirectChainedMap
          (DirectChainedMap<TypeLookupResult> *this,Allocator *allocator)

{
  int iVar1;
  undefined4 extraout_var;
  Allocator *allocator_local;
  DirectChainedMap<TypeLookupResult> *this_local;
  
  this->allocator = allocator;
  if (allocator != (Allocator *)0x0) {
    this->bucketCount = 4;
    this->count = 0;
    iVar1 = (*allocator->_vptr_Allocator[2])();
    this->data = (Node *)CONCAT44(extraout_var,iVar1);
    NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 5);
    return;
  }
  __assert_fail("allocator",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0x176,
                "DirectChainedMap<TypeLookupResult>::DirectChainedMap(Allocator *) [Value = TypeLookupResult]"
               );
}

Assistant:

DirectChainedMap(Allocator *allocator) : allocator(allocator)
	{
		assert(allocator);

		bucketCount = 4;
		count = 0;

		data = (Node*)allocator->alloc(sizeof(Node) * bucketCount);
		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);
	}